

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

Reference __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_testing::NiceMock<MockNLHandler>_>
::ReadReference(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_testing::NiceMock<MockNLHandler>_>
                *this)

{
  char cVar1;
  Reference RVar2;
  undefined8 *in_RDI;
  BinaryReaderBase *in_stack_00000008;
  CStringRef in_stack_00000010;
  BasicCStringRef<char> in_stack_ffffffffffffffe8;
  
  cVar1 = ReaderBase::ReadChar((ReaderBase *)*in_RDI);
  if (cVar1 != 'v') {
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xffffffffffffffe8,"expected reference");
    BinaryReaderBase::ReportError<>(in_stack_00000008,in_stack_00000010);
  }
  RVar2 = DoReadReference((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_testing::NiceMock<MockNLHandler>_>
                           *)in_stack_ffffffffffffffe8.data_);
  return (Reference)RVar2.id_;
}

Assistant:

Reference ReadReference() {
    if (reader_.ReadChar() != 'v')
      reader_.ReportError("expected reference");
    return DoReadReference();
  }